

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::CustomOptions_OptionTypes_Test::
CustomOptions_OptionTypes_Test(CustomOptions_OptionTypes_Test *this)

{
  CustomOptions_OptionTypes_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CustomOptions_OptionTypes_Test_029a7ce8;
  return;
}

Assistant:

TEST(CustomOptions, OptionTypes) {
  const MessageOptions* options = nullptr;

  constexpr int32_t kint32min = std::numeric_limits<int32_t>::min();
  constexpr int32_t kint32max = std::numeric_limits<int32_t>::max();
  constexpr uint32_t kuint32max = std::numeric_limits<uint32_t>::max();
  constexpr int64_t kint64min = std::numeric_limits<int64_t>::min();
  constexpr int64_t kint64max = std::numeric_limits<int64_t>::max();
  constexpr uint64_t kuint64max = std::numeric_limits<uint64_t>::max();

  options =
      &proto2_unittest::CustomOptionMinIntegerValues::descriptor()->options();
  EXPECT_EQ(false, options->GetExtension(proto2_unittest::bool_opt));
  EXPECT_EQ(kint32min, options->GetExtension(proto2_unittest::int32_opt));
  EXPECT_EQ(kint64min, options->GetExtension(proto2_unittest::int64_opt));
  EXPECT_EQ(0, options->GetExtension(proto2_unittest::uint32_opt));
  EXPECT_EQ(0, options->GetExtension(proto2_unittest::uint64_opt));
  EXPECT_EQ(kint32min, options->GetExtension(proto2_unittest::sint32_opt));
  EXPECT_EQ(kint64min, options->GetExtension(proto2_unittest::sint64_opt));
  EXPECT_EQ(0, options->GetExtension(proto2_unittest::fixed32_opt));
  EXPECT_EQ(0, options->GetExtension(proto2_unittest::fixed64_opt));
  EXPECT_EQ(kint32min, options->GetExtension(proto2_unittest::sfixed32_opt));
  EXPECT_EQ(kint64min, options->GetExtension(proto2_unittest::sfixed64_opt));

  options =
      &proto2_unittest::CustomOptionMaxIntegerValues::descriptor()->options();
  EXPECT_EQ(true, options->GetExtension(proto2_unittest::bool_opt));
  EXPECT_EQ(kint32max, options->GetExtension(proto2_unittest::int32_opt));
  EXPECT_EQ(kint64max, options->GetExtension(proto2_unittest::int64_opt));
  EXPECT_EQ(kuint32max, options->GetExtension(proto2_unittest::uint32_opt));
  EXPECT_EQ(kuint64max, options->GetExtension(proto2_unittest::uint64_opt));
  EXPECT_EQ(kint32max, options->GetExtension(proto2_unittest::sint32_opt));
  EXPECT_EQ(kint64max, options->GetExtension(proto2_unittest::sint64_opt));
  EXPECT_EQ(kuint32max, options->GetExtension(proto2_unittest::fixed32_opt));
  EXPECT_EQ(kuint64max, options->GetExtension(proto2_unittest::fixed64_opt));
  EXPECT_EQ(kint32max, options->GetExtension(proto2_unittest::sfixed32_opt));
  EXPECT_EQ(kint64max, options->GetExtension(proto2_unittest::sfixed64_opt));

  options = &proto2_unittest::CustomOptionOtherValues::descriptor()->options();
  EXPECT_EQ(-100, options->GetExtension(proto2_unittest::int32_opt));
  EXPECT_FLOAT_EQ(12.3456789,
                  options->GetExtension(proto2_unittest::float_opt));
  EXPECT_DOUBLE_EQ(1.234567890123456789,
                   options->GetExtension(proto2_unittest::double_opt));
  EXPECT_EQ("Hello, \"World\"",
            options->GetExtension(proto2_unittest::string_opt));

  EXPECT_EQ(std::string("Hello\0World", 11),
            options->GetExtension(proto2_unittest::bytes_opt));

  EXPECT_EQ(proto2_unittest::DummyMessageContainingEnum::TEST_OPTION_ENUM_TYPE2,
            options->GetExtension(proto2_unittest::enum_opt));

  options =
      &proto2_unittest::SettingRealsFromPositiveInts::descriptor()->options();
  EXPECT_FLOAT_EQ(12, options->GetExtension(proto2_unittest::float_opt));
  EXPECT_DOUBLE_EQ(154, options->GetExtension(proto2_unittest::double_opt));

  options =
      &proto2_unittest::SettingRealsFromNegativeInts::descriptor()->options();
  EXPECT_FLOAT_EQ(-12, options->GetExtension(proto2_unittest::float_opt));
  EXPECT_DOUBLE_EQ(-154, options->GetExtension(proto2_unittest::double_opt));
}